

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressionTables.cpp
# Opt level: O3

void testB44Table(string *param_1)

{
  int iVar1;
  undefined3 uVar2;
  char cVar3;
  uint16_t *puVar4;
  uint16_t uVar5;
  byte bVar6;
  uint16_t *in_RCX;
  float fVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  float fVar11;
  
  lVar10 = _imath_half_to_float_table;
  puVar4 = exrcore_expTable;
  lVar9 = 0;
  while( true ) {
    if ((~(uint)lVar9 & 0x7c00) == 0) {
      uVar5 = 0;
    }
    else {
      fVar7 = *(float *)(lVar10 + lVar9 * 4);
      uVar5 = 0x7bff;
      if (fVar7 < 88.71893) {
        fVar11 = expf(fVar7 * 0.125);
        fVar7 = ABS(fVar11);
        uVar5 = (ushort)((uint)fVar11 >> 0x10) & 0x8000;
        if ((uint)fVar7 < 0x38800000) {
          if (0x33000000 < (uint)fVar7) {
            uVar8 = (uint)fVar11 & 0x7fffff | 0x800000;
            iVar1 = ((uint)fVar7 >> 0x17) - 0x5e;
            uVar2 = (undefined3)((uint)iVar1 >> 8);
            bVar6 = 0x7e - (char)((uint)fVar7 >> 0x17);
            in_RCX = (uint16_t *)(ulong)CONCAT31(uVar2,bVar6);
            uVar5 = uVar5 | (ushort)(uVar8 >> (bVar6 & 0x1f));
            if (uVar8 << ((byte)iVar1 & 0x1f) < 0x80000001) {
              in_RCX = (uint16_t *)(ulong)CONCAT31(uVar2,1);
            }
            else {
              uVar5 = uVar5 + 1;
            }
          }
        }
        else if ((uint)fVar7 < 0x7f800000) {
          if ((uint)fVar7 < 0x477ff000) {
            uVar5 = (ushort)((int)fVar7 + 0x8000fffU + (uint)(((uint)fVar7 >> 0xd & 1) != 0) >> 0xd)
                    | uVar5;
          }
          else {
            uVar5 = uVar5 | 0x7c00;
          }
        }
        else {
          uVar5 = uVar5 | 0x7c00;
          if (fVar7 != INFINITY) {
            uVar8 = (uint)fVar7 >> 0xd & 0x3ff;
            in_RCX = (uint16_t *)(ulong)(uVar8 == 0);
            uVar5 = uVar5 | (ushort)uVar8 | (ushort)(uVar8 == 0);
          }
        }
      }
    }
    if (puVar4[lVar9] != uVar5) break;
    lVar9 = lVar9 + 1;
    if (lVar9 == 0x10000) {
      lVar10 = 0;
      while( true ) {
        if (((~(uint)lVar10 & 0x7c00) == 0) ||
           (fVar7 = *(float *)(_imath_half_to_float_table + lVar10 * 4), fVar7 < 0.0)) {
          uVar5 = 0;
        }
        else {
          fVar11 = logf(fVar7);
          fVar7 = ABS(fVar11 * 8.0);
          uVar5 = (ushort)((uint)(fVar11 * 8.0) >> 0x10) & 0x8000;
          if ((uint)fVar7 < 0x38800000) {
            if ((0x33000000 < (uint)fVar7) &&
               (uVar8 = (uint)fVar7 & 0x7fffff | 0x800000, cVar3 = (char)((uint)fVar7 >> 0x17),
               uVar5 = uVar5 | (ushort)(uVar8 >> (0x7eU - cVar3 & 0x1f)),
               0x80000000 < uVar8 << (cVar3 + 0xa2U & 0x1f))) {
              uVar5 = uVar5 + 1;
            }
          }
          else if ((uint)fVar7 < 0x7f800000) {
            if ((uint)fVar7 < 0x477ff000) {
              uVar5 = (ushort)((int)fVar7 + 0x8000fff + (uint)(((uint)fVar7 >> 0xd & 1) != 0) >> 0xd
                              ) | uVar5;
            }
            else {
              uVar5 = uVar5 | 0x7c00;
            }
          }
          else {
            uVar5 = uVar5 | 0x7c00;
            if (fVar7 != INFINITY) {
              uVar8 = (uint)fVar7 >> 0xd & 0x3ff;
              uVar5 = uVar5 | (ushort)uVar8 | (ushort)(uVar8 == 0);
            }
          }
        }
        in_RCX = exrcore_logTable;
        if (exrcore_logTable[lVar10] != uVar5) break;
        lVar10 = lVar10 + 1;
        if (lVar10 == 0x10000) {
          return;
        }
      }
LAB_00118de5:
      core_test_fail("exrcore_logTable[i] == h.bits ()",(char *)0x641,0x343286,(char *)in_RCX);
      return;
    }
  }
  core_test_fail("exrcore_expTable[i] == h.bits ()",(char *)0x634,0x343286,(char *)in_RCX);
  goto LAB_00118de5;
}

Assistant:

void
testB44Table (const std::string&)
{
    const int iMax = (1 << 16);

    for (int i = 0; i < iMax; i++)
    {
        half h;
        h.setBits (i);

        if (!h.isFinite ())
            h = 0;
        else if (h >= 8 * log (HALF_MAX))
            h = HALF_MAX;
        else
            h = exp (h / 8);

        EXRCORE_TEST (exrcore_expTable[i] == h.bits ());
    }

    for (int i = 0; i < iMax; i++)
    {
        half h;
        h.setBits (i);

        if (!h.isFinite () || h < 0)
            h = 0;
        else
            h = 8 * log (h);

        EXRCORE_TEST (exrcore_logTable[i] == h.bits ());
    }
}